

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkLock::IntToDescriptor
          (ChLinkLock *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  ChLinkLimit *pCVar4;
  long lVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  long lVar7;
  long lVar8;
  int iVar9;
  
  lVar7 = CONCAT44(in_register_00000034,off_v);
  lVar5 = (long)(this->mask).super_ChLinkMask.nconstr;
  if (0 < lVar5) {
    R = (ChVectorDynamic<> *)
        (this->mask).super_ChLinkMask.constraints.
        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
        ._M_impl.super__Vector_impl_data._M_start;
    v = (ChStateDelta *)
        (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar7 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    pdVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    lVar8 = 0;
    iVar9 = 0;
    do {
      if ((this->mask).super_ChLinkMask.nconstr <= lVar8) {
LAB_00586742:
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      pdVar3 = (&(R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data)[lVar8];
      if (*(char *)((long)pdVar3 + 0x2c) == '\x01') {
        uVar6 = (ulong)(iVar9 + off_L);
        if (lVar7 <= (long)uVar6) goto LAB_00586761;
        pdVar3[2] = (double)(&(v->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data)[uVar6];
        if ((this->mask).super_ChLinkMask.nconstr <= lVar8) goto LAB_00586742;
        if (lVar2 <= (long)uVar6) goto LAB_00586761;
        iVar9 = iVar9 + 1;
        pdVar3[3] = pdVar1[uVar6];
      }
      lVar8 = lVar8 + 1;
    } while (lVar5 != lVar8);
  }
  iVar9 = (*(this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
            super_ChObj._vptr_ChObj[0x19])(this,lVar7,v,R);
  pCVar4 = (this->limit_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    if ((pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      uVar6 = (ulong)(iVar9 + off_L);
      if (((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
           (long)uVar6) ||
         ((pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i =
               (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar6],
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar6)) goto LAB_00586761;
      iVar9 = iVar9 + 1;
      (pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
    }
    if ((pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      uVar6 = (ulong)(iVar9 + off_L);
      if (((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
           (long)uVar6) ||
         ((pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i =
               (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar6],
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar6)) goto LAB_00586761;
      iVar9 = iVar9 + 1;
      (pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
    }
  }
  pCVar4 = (this->limit_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    if ((pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      uVar6 = (ulong)(iVar9 + off_L);
      if (((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
           (long)uVar6) ||
         ((pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i =
               (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar6],
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar6)) goto LAB_00586761;
      iVar9 = iVar9 + 1;
      (pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
    }
    if ((pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      uVar6 = (ulong)(iVar9 + off_L);
      if (((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
           (long)uVar6) ||
         ((pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i =
               (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar6],
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar6)) goto LAB_00586761;
      iVar9 = iVar9 + 1;
      (pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
    }
  }
  pCVar4 = (this->limit_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    if ((pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      uVar6 = (ulong)(iVar9 + off_L);
      if (((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
           (long)uVar6) ||
         ((pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i =
               (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar6],
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar6)) goto LAB_00586761;
      iVar9 = iVar9 + 1;
      (pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
    }
    if ((pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      uVar6 = (ulong)(iVar9 + off_L);
      if (((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
           (long)uVar6) ||
         ((pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i =
               (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar6],
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar6)) goto LAB_00586761;
      iVar9 = iVar9 + 1;
      (pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
    }
  }
  pCVar4 = (this->limit_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    if ((pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      uVar6 = (ulong)(iVar9 + off_L);
      if (((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
           (long)uVar6) ||
         ((pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i =
               (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar6],
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar6)) goto LAB_00586761;
      iVar9 = iVar9 + 1;
      (pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
    }
    if ((pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      uVar6 = (ulong)(iVar9 + off_L);
      if (((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
           (long)uVar6) ||
         ((pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i =
               (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar6],
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar6)) goto LAB_00586761;
      iVar9 = iVar9 + 1;
      (pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
    }
  }
  pCVar4 = (this->limit_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    if ((pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      uVar6 = (ulong)(iVar9 + off_L);
      if (((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
           (long)uVar6) ||
         ((pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i =
               (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar6],
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar6)) goto LAB_00586761;
      iVar9 = iVar9 + 1;
      (pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
    }
    if ((pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      uVar6 = (ulong)(iVar9 + off_L);
      if (((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
           (long)uVar6) ||
         ((pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i =
               (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar6],
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar6)) goto LAB_00586761;
      iVar9 = iVar9 + 1;
      (pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
    }
  }
  pCVar4 = (this->limit_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    if ((pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      uVar6 = (ulong)(iVar9 + off_L);
      if (((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
           (long)uVar6) ||
         ((pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i =
               (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar6],
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar6)) goto LAB_00586761;
      iVar9 = iVar9 + 1;
      (pCVar4->constr_lower).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
    }
    if ((pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      uVar6 = (ulong)(iVar9 + off_L);
      if (((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
           (long)uVar6) ||
         ((pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i =
               (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar6],
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar6)) {
LAB_00586761:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      (pCVar4->constr_upper).super_ChConstraintTwo.super_ChConstraint.b_i =
           (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar6];
    }
  }
  return;
}

Assistant:

void ChLinkLock::IntToDescriptor(const unsigned int off_v,
                                 const ChStateDelta& v,
                                 const ChVectorDynamic<>& R,
                                 const unsigned int off_L,
                                 const ChVectorDynamic<>& L,
                                 const ChVectorDynamic<>& Qc) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            mask.Constr_N(i).Set_l_i(L(off_L + cnt));
            mask.Constr_N(i).Set_b_i(Qc(off_L + cnt));
            cnt++;
        }
    }

    int local_offset = this->GetDOC_c();

    if (limit_X && limit_X->IsActive()) {
        if (limit_X->constr_lower.IsActive()) {
            limit_X->constr_lower.Set_l_i(L(off_L + local_offset));
            limit_X->constr_lower.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
        if (limit_X->constr_upper.IsActive()) {
            limit_X->constr_upper.Set_l_i(L(off_L + local_offset));
            limit_X->constr_upper.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
    }
    if (limit_Y && limit_Y->IsActive()) {
        if (limit_Y->constr_lower.IsActive()) {
            limit_Y->constr_lower.Set_l_i(L(off_L + local_offset));
            limit_Y->constr_lower.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
        if (limit_Y->constr_upper.IsActive()) {
            limit_Y->constr_upper.Set_l_i(L(off_L + local_offset));
            limit_Y->constr_upper.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
    }
    if (limit_Z && limit_Z->IsActive()) {
        if (limit_Z->constr_lower.IsActive()) {
            limit_Z->constr_lower.Set_l_i(L(off_L + local_offset));
            limit_Z->constr_lower.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
        if (limit_Z->constr_upper.IsActive()) {
            limit_Z->constr_upper.Set_l_i(L(off_L + local_offset));
            limit_Z->constr_upper.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
    }
    if (limit_Rx && limit_Rx->IsActive()) {
        if (limit_Rx->constr_lower.IsActive()) {
            limit_Rx->constr_lower.Set_l_i(L(off_L + local_offset));
            limit_Rx->constr_lower.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
        if (limit_Rx->constr_upper.IsActive()) {
            limit_Rx->constr_upper.Set_l_i(L(off_L + local_offset));
            limit_Rx->constr_upper.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        if (limit_Ry->constr_lower.IsActive()) {
            limit_Ry->constr_lower.Set_l_i(L(off_L + local_offset));
            limit_Ry->constr_lower.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
        if (limit_Ry->constr_upper.IsActive()) {
            limit_Ry->constr_upper.Set_l_i(L(off_L + local_offset));
            limit_Ry->constr_upper.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        if (limit_Rz->constr_lower.IsActive()) {
            limit_Rz->constr_lower.Set_l_i(L(off_L + local_offset));
            limit_Rz->constr_lower.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
        if (limit_Rz->constr_upper.IsActive()) {
            limit_Rz->constr_upper.Set_l_i(L(off_L + local_offset));
            limit_Rz->constr_upper.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
    }
}